

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::COMBICState::Encode(COMBICState *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32TSC);
  (*(this->m_MunSrc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_MunSrc,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumSrcs);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16GeometryIndex);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32SrcType);
  KDataStream::Write<float>(stream,(float)this->m_f32BarrageRate);
  KDataStream::Write<float>(stream,(float)this->m_f32BarrageDuration);
  KDataStream::Write<float>(stream,(float)this->m_f32BarrageCrosswindLength);
  KDataStream::Write<float>(stream,(float)this->m_f32BarrageDownwindLength);
  (*(this->m_DetVel).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_DetVel,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  return;
}

Assistant:

void COMBICState::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << m_ui32TSC
           << KDIS_STREAM m_MunSrc
           << m_ui32NumSrcs
           << m_ui16GeometryIndex
           << m_ui16Padding
           << m_ui32SrcType
           << m_f32BarrageRate
           << m_f32BarrageDuration
           << m_f32BarrageCrosswindLength
           << m_f32BarrageDownwindLength
           << KDIS_STREAM m_DetVel
           << m_ui32Padding;
}